

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_out_movi(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,tcg_target_long arg)

{
  long lVar1;
  uint32_t uVar2;
  tcg_target_long diff;
  tcg_target_long arg_local;
  TCGReg ret_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  if (type < TCG_TYPE_V64) {
    if (ret < TCG_REG_XMM0) {
      if (arg == 0) {
        tgen_arithr(s,6,ret,ret);
        return;
      }
      uVar2 = (uint32_t)arg;
      if ((arg == (arg & 0xffffffffU)) || (type == TCG_TYPE_I32)) {
        tcg_out_opc(s,(ret & TCG_REG_EDI) + 0xb8,0,ret,0);
        tcg_out32(s,uVar2);
        return;
      }
      if (arg == (int)uVar2) {
        tcg_out_modrm(s,0x10c7,0,ret);
        tcg_out32(s,uVar2);
        return;
      }
      lVar1 = arg - (long)(s->code_ptr + 7);
      uVar2 = (uint32_t)lVar1;
      if (lVar1 == (int)uVar2) {
        tcg_out_opc(s,0x108d,ret,0,0);
        tcg_out8(s,(byte)((ret & TCG_REG_EDI) << 3) | 5);
        tcg_out32(s,uVar2);
        return;
      }
      tcg_out_opc(s,(ret & TCG_REG_EDI) + 0x10b8,0,ret,0);
      tcg_out64(s,arg);
      return;
    }
  }
  else if (2 < type - TCG_TYPE_V64) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x3ee,(char *)0x0);
  }
  tcg_out_dupi_vec(s,type,ret,arg);
  return;
}

Assistant:

static void tcg_out_movi(TCGContext *s, TCGType type,
                         TCGReg ret, tcg_target_long arg)
{
    tcg_target_long diff;

    switch (type) {
    case TCG_TYPE_I32:
#if TCG_TARGET_REG_BITS == 64
    case TCG_TYPE_I64:
#endif
        if (ret < 16) {
            break;
        }
        /* fallthru */
    case TCG_TYPE_V64:
    case TCG_TYPE_V128:
    case TCG_TYPE_V256:
        tcg_debug_assert(ret >= 16);
        tcg_out_dupi_vec(s, type, ret, arg);
        return;
    default:
        g_assert_not_reached();
    }

    if (arg == 0) {
        tgen_arithr(s, ARITH_XOR, ret, ret);
        return;
    }
    if (arg == (uint32_t)arg || type == TCG_TYPE_I32) {
        tcg_out_opc(s, OPC_MOVL_Iv + LOWREGMASK(ret), 0, ret, 0);
        tcg_out32(s, arg);
        return;
    }
    if (arg == (int32_t)arg) {
        tcg_out_modrm(s, OPC_MOVL_EvIz + P_REXW, 0, ret);
        tcg_out32(s, arg);
        return;
    }

    /* Try a 7 byte pc-relative lea before the 10 byte movq.  */
    diff = arg - ((uintptr_t)s->code_ptr + 7);
    if (diff == (int32_t)diff) {
        tcg_out_opc(s, OPC_LEA | P_REXW, ret, 0, 0);
        tcg_out8(s, (LOWREGMASK(ret) << 3) | 5);
        tcg_out32(s, diff);
        return;
    }

    tcg_out_opc(s, OPC_MOVL_Iv + P_REXW + LOWREGMASK(ret), 0, ret, 0);
    tcg_out64(s, arg);
}